

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O0

void stbiw__linear_to_rgbe(uchar *rgbe,float *linear)

{
  double dVar1;
  float local_34;
  float local_30;
  float local_2c;
  float normalize;
  float maxcomp;
  int exponent;
  float *linear_local;
  uchar *rgbe_local;
  
  if (linear[1] < linear[2] || linear[1] == linear[2]) {
    local_2c = linear[2];
  }
  else {
    local_2c = linear[1];
  }
  if (*linear <= local_2c) {
    if (linear[1] < linear[2] || linear[1] == linear[2]) {
      local_34 = linear[2];
    }
    else {
      local_34 = linear[1];
    }
    local_30 = local_34;
  }
  else {
    local_30 = *linear;
  }
  if (1e-32 <= local_30) {
    _maxcomp = linear;
    linear_local = (float *)rgbe;
    dVar1 = frexp((double)local_30,(int *)&normalize);
    local_30 = ((float)dVar1 * 256.0) / local_30;
    *(char *)linear_local = (char)(int)(*_maxcomp * local_30);
    *(char *)((long)linear_local + 1) = (char)(int)(_maxcomp[1] * local_30);
    *(char *)((long)linear_local + 2) = (char)(int)(_maxcomp[2] * local_30);
    *(char *)((long)linear_local + 3) = normalize._0_1_ + -0x80;
  }
  else {
    rgbe[3] = '\0';
    rgbe[2] = '\0';
    rgbe[1] = '\0';
    *rgbe = '\0';
  }
  return;
}

Assistant:

static void stbiw__linear_to_rgbe(unsigned char *rgbe, float *linear)
{
   int exponent;
   float maxcomp = stbiw__max(linear[0], stbiw__max(linear[1], linear[2]));

   if (maxcomp < 1e-32f) {
      rgbe[0] = rgbe[1] = rgbe[2] = rgbe[3] = 0;
   } else {
      float normalize = (float) frexp(maxcomp, &exponent) * 256.0f/maxcomp;

      rgbe[0] = (unsigned char)(linear[0] * normalize);
      rgbe[1] = (unsigned char)(linear[1] * normalize);
      rgbe[2] = (unsigned char)(linear[2] * normalize);
      rgbe[3] = (unsigned char)(exponent + 128);
   }
}